

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O1

void __thiscall
anon_unknown.dwarf_9d44d2::TransformSelectorFor::~TransformSelectorFor(TransformSelectorFor *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer piVar2;
  pointer pcVar3;
  
  (this->super_TransformSelectorIndexes).super_TransformSelector._vptr_TransformSelector =
       (_func_int **)&PTR__TransformSelectorIndexes_005d4858;
  piVar2 = (this->super_TransformSelectorIndexes).Indexes.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->super_TransformSelectorIndexes).Indexes.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  (this->super_TransformSelectorIndexes).super_TransformSelector._vptr_TransformSelector =
       (_func_int **)&PTR__TransformSelector_005d47b8;
  pcVar3 = (this->super_TransformSelectorIndexes).super_TransformSelector.Tag._M_dataplus._M_p;
  paVar1 = &(this->super_TransformSelectorIndexes).super_TransformSelector.Tag.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x50);
  return;
}

Assistant:

TransformSelectorFor(int start, int stop, int step)
    : TransformSelectorIndexes("FOR")
    , Start(start)
    , Stop(stop)
    , Step(step)
  {
  }